

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O2

Music_Emu * new_kss_file(void)

{
  Kss_File *this;
  
  this = (Kss_File *)malloc(0x1b0);
  if (this != (Kss_File *)0x0) {
    Kss_File::Kss_File(this);
  }
  return (Music_Emu *)this;
}

Assistant:

void Kss_Emu::update_gain()
{
	double g = gain() * 1.4;
	if ( scc_accessed )
		g *= 1.5;
	ay.volume( g );
	scc.volume( g );
	if ( sn )
		sn->volume( g );
}